

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O3

PyObject * libxml_xmlParserCtxtSetErrorHandler(PyObject *self,PyObject *args)

{
  long lVar1;
  long *plVar2;
  int iVar3;
  undefined8 *puVar4;
  PyObject *pPVar5;
  long lVar6;
  code *pcVar7;
  PyObject *pyobj_f;
  PyObject *pyobj_arg;
  PyObject *pyobj_ctxt;
  long *local_28;
  long *local_20;
  long local_18;
  
  iVar3 = _PyArg_ParseTuple_SizeT
                    (args,"OOO:xmlParserCtxtSetErrorHandler",&local_18,&local_28,&local_20);
  if (iVar3 == 0) {
    return (PyObject *)0x0;
  }
  lVar1 = *(long *)(local_18 + 0x10);
  puVar4 = *(undefined8 **)(lVar1 + 0x1a8);
  if (puVar4 == (undefined8 *)0x0) {
    puVar4 = (undefined8 *)(*_xmlMalloc)(0x10);
    if (puVar4 == (undefined8 *)0x0) {
      iVar3 = -1;
      goto LAB_0013de28;
    }
    *puVar4 = 0;
    puVar4[1] = 0;
    *(undefined8 **)(lVar1 + 0x1a8) = puVar4;
  }
  else {
    plVar2 = (long *)*puVar4;
    if ((plVar2 != (long *)0x0) && (*plVar2 = *plVar2 + -1, *plVar2 == 0)) {
      _Py_Dealloc();
    }
  }
  if (local_28 != (long *)0x0) {
    *local_28 = *local_28 + 1;
  }
  *puVar4 = local_28;
  plVar2 = (long *)puVar4[1];
  if ((plVar2 != (long *)0x0) && (*plVar2 = *plVar2 + -1, *plVar2 == 0)) {
    _Py_Dealloc();
  }
  if (local_20 != (long *)0x0) {
    *local_20 = *local_20 + 1;
  }
  puVar4[1] = local_20;
  if (local_28 == (long *)&_Py_NoneStruct) {
    pcVar7 = (code *)0x0;
    lVar6 = 0;
  }
  else {
    pcVar7 = libxml_xmlParserCtxtErrorHandler;
    lVar6 = lVar1;
  }
  xmlCtxtSetErrorHandler(lVar1,pcVar7,lVar6);
  iVar3 = 1;
LAB_0013de28:
  pPVar5 = libxml_intWrap(iVar3);
  return pPVar5;
}

Assistant:

static PyObject *
libxml_xmlParserCtxtSetErrorHandler(ATTRIBUTE_UNUSED PyObject *self, PyObject *args) 
{
    PyObject *py_retval;
    xmlParserCtxtPtr ctxt;
    xmlParserCtxtPyCtxtPtr pyCtxt;
    PyObject *pyobj_ctxt;
    PyObject *pyobj_f;
    PyObject *pyobj_arg;

    if (!PyArg_ParseTuple(args, (char *)"OOO:xmlParserCtxtSetErrorHandler",
		          &pyobj_ctxt, &pyobj_f, &pyobj_arg))
        return(NULL);
    ctxt = (xmlParserCtxtPtr) PyparserCtxt_Get(pyobj_ctxt);
    if (ctxt->_private == NULL) {
	pyCtxt = xmlMalloc(sizeof(xmlParserCtxtPyCtxt));
	if (pyCtxt == NULL) {
	    py_retval = libxml_intWrap(-1);
	    return(py_retval);
	}
	memset(pyCtxt,0,sizeof(xmlParserCtxtPyCtxt));
	ctxt->_private = pyCtxt;
    }
    else {
	pyCtxt = (xmlParserCtxtPyCtxtPtr)ctxt->_private;
    }
    /* TODO: check f is a function ! */
    Py_XDECREF(pyCtxt->f);
    Py_XINCREF(pyobj_f);
    pyCtxt->f = pyobj_f;
    Py_XDECREF(pyCtxt->arg);
    Py_XINCREF(pyobj_arg);
    pyCtxt->arg = pyobj_arg;

    if (pyobj_f != Py_None) {
        xmlCtxtSetErrorHandler(ctxt, libxml_xmlParserCtxtErrorHandler, ctxt);
    }
    else {
        xmlCtxtSetErrorHandler(ctxt, NULL, NULL);
    }

    py_retval = libxml_intWrap(1);
    return(py_retval);
}